

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPolarDecomposition.cpp
# Opt level: O2

double chrono::fea::PolarDecomposition::oneNorm(double *A)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar2 = ZEXT816(0) << 0x40;
  lVar1 = -0x18;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  while (lVar1 != 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)A + lVar1 + 0x18);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)A + lVar1 + 0x30);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)((long)A + lVar1 + 0x48);
    lVar1 = lVar1 + 8;
    auVar4 = vandpd_avx(auVar4,auVar3);
    auVar6 = vandpd_avx(auVar6,auVar3);
    auVar7 = vandpd_avx(auVar7,auVar3);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = auVar4._0_8_ + auVar6._0_8_ + auVar7._0_8_;
    auVar2 = vmaxsd_avx(auVar5,auVar2);
  }
  return auVar2._0_8_;
}

Assistant:

double PolarDecomposition::oneNorm(const double* A) {
    double norm = 0.0;
    for (int i = 0; i < 3; i++) {
        double columnAbsSum = fabs(A[i + 0]) + fabs(A[i + 3]) + fabs(A[i + 6]);
        if (columnAbsSum > norm)
            norm = columnAbsSum;
    }
    return norm;
}